

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nwkUtil.c
# Opt level: O0

void Nwk_ManRemoveDupFanins(Nwk_Man_t *pNtk,int fVerbose)

{
  bool bVar1;
  int iVar2;
  Vec_Int_t *vTruth_00;
  Nwk_Obj_t *p;
  int local_34;
  int fFound;
  int m;
  int k;
  int i;
  Nwk_Obj_t *pObj;
  Vec_Int_t *vTruth;
  int fVerbose_local;
  Nwk_Man_t *pNtk_local;
  
  vTruth_00 = Vec_IntAlloc(0x10000);
  m = 0;
  do {
    iVar2 = Vec_PtrSize(pNtk->vObjs);
    if (iVar2 <= m) {
      Vec_IntFree(vTruth_00);
      return;
    }
    p = (Nwk_Obj_t *)Vec_PtrEntry(pNtk->vObjs,m);
    if ((p != (Nwk_Obj_t *)0x0) && (iVar2 = Nwk_ObjIsNode(p), iVar2 != 0)) {
      bVar1 = false;
      for (fFound = 0; local_34 = fFound, fFound < p->nFanins; fFound = fFound + 1) {
        do {
          local_34 = local_34 + 1;
          if (p->nFanins <= local_34) goto LAB_00605f7a;
        } while (p->pFanio[fFound] != p->pFanio[local_34]);
        if (fVerbose != 0) {
          printf("Removing duplicated fanins of node %d (fanins %d and %d).\n",(ulong)(uint)p->Id,
                 (ulong)(uint)p->pFanio[fFound]->Id,(ulong)(uint)p->pFanio[local_34]->Id);
        }
        Nwk_ManRemoveDupFaninsNode(p,fFound,local_34,vTruth_00);
        bVar1 = true;
LAB_00605f7a:
        if (bVar1) break;
      }
    }
    m = m + 1;
  } while( true );
}

Assistant:

void Nwk_ManRemoveDupFanins( Nwk_Man_t * pNtk, int fVerbose )
{
    Vec_Int_t * vTruth;
    Nwk_Obj_t * pObj;
    int i, k, m, fFound;
    // check if the nodes have duplicated fanins
    vTruth = Vec_IntAlloc( 1 << 16 );
    Nwk_ManForEachNode( pNtk, pObj, i )
    {
        fFound = 0;
        for ( k = 0; k < pObj->nFanins; k++ )
        {
            for ( m = k + 1; m < pObj->nFanins; m++ )
                if ( pObj->pFanio[k] == pObj->pFanio[m] )
                {
                    if ( fVerbose )
                        printf( "Removing duplicated fanins of node %d (fanins %d and %d).\n", 
                            pObj->Id, pObj->pFanio[k]->Id, pObj->pFanio[m]->Id );
                    Nwk_ManRemoveDupFaninsNode( pObj, k, m, vTruth );
                    fFound = 1;
                    break;
                }
            if ( fFound )
                break;
        }
    }
    Vec_IntFree( vTruth );
//    Nwk_ManMinimumBase( pNtk, fVerbose );
}